

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_test.c
# Opt level: O2

void vdpp_test(VdppTestCfg *cfg)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RK_U32 RVar3;
  MppFrameFormat MVar4;
  RK_U32 *p_hist_global;
  byte bVar5;
  int iVar6;
  RK_S32 RVar7;
  MPP_RET MVar8;
  vdpp_com_ctx *ctx;
  void *__ptr;
  RK_U8 *p_pack_hist_addr;
  long lVar9;
  size_t sVar10;
  int *piVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  VdppCmd VVar15;
  uint uVar16;
  RK_U32 *pRVar17;
  ulong __n;
  uint uVar18;
  bool bVar19;
  undefined8 uStackY_6a0;
  RK_U32 RVar20;
  RK_U32 RVar21;
  ulong uVar22;
  MppBufferGroup memGroup;
  RK_U32 *local_668;
  RK_U8 *local_660;
  RK_S32 local_654;
  int local_650;
  RK_S32 fdhist;
  RK_U8 *local_648;
  MppBuffer histbuf;
  MppBuffer dstbuf;
  vdpp_com_ctx *local_630;
  ulong local_628;
  MppBuffer histbuf_g;
  MppBuffer dstbuf_c;
  MppBuffer srcbuf;
  RK_S32 local_608;
  RK_S32 local_604;
  ulong local_600;
  RK_U32 *local_5f8;
  MppBuffer histbuf_l;
  DataCrc checkcrc;
  VdppImg imgdst_c;
  VdppImg imgdst;
  VdppImg imgsrc;
  undefined4 local_590 [2];
  MppFrameFormat local_588;
  RK_U32 local_584;
  RK_U32 local_580;
  RK_U32 local_57c;
  undefined8 uStack_578;
  undefined8 uStack_570;
  RK_U32 local_568;
  RK_U32 RStack_564;
  RK_U32 RStack_560;
  RK_U32 RStack_55c;
  uint local_558;
  RK_U32 local_554;
  RK_U32 RStack_550;
  RK_U32 RStack_54c;
  RK_U32 RStack_548;
  RK_U32 local_544;
  RK_U32 local_540 [324];
  
  ctx = rockchip_vdpp_api_alloc_ctx();
  RVar21 = cfg->src_width_vir;
  RVar3 = cfg->src_height_vir;
  MVar4 = cfg->src_format;
  uVar16 = (MVar4 & 0xfffff) - MPP_FMT_RGB565;
  if (uVar16 < 0xe) {
    if ((0x3fU >> (uVar16 & 0x1f) & 1) == 0) {
      if ((0x3f00U >> (uVar16 & 0x1f) & 1) != 0) goto LAB_00103489;
      uVar16 = RVar3 * RVar21 * 3;
    }
    else {
LAB_001034a6:
      uVar16 = RVar3 * RVar21 * 2;
    }
  }
  else {
    if ((MVar4 & 0xfffff) < MPP_FMT_YUV400) {
      if ((0xf44U >> (MVar4 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) goto LAB_001034a6;
      if ((0x11U >> (MVar4 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar16 = RVar3 * RVar21 * 3 >> 1;
        goto LAB_001034ad;
      }
    }
LAB_00103489:
    uVar16 = RVar3 * RVar21 * 4;
  }
LAB_001034ad:
  if (cfg->dst_fmt == 3) {
    uVar14 = (ulong)(cfg->dst_width_vir * cfg->dst_height_vir * 3 >> 1);
  }
  else if (cfg->dst_fmt == 0) {
    uVar14 = (ulong)(cfg->dst_width_vir * cfg->dst_height_vir * 3);
  }
  else {
    uVar14 = 0;
    _mpp_log_l(2,"vdpp_test","warning: unsupported input format %d",0);
  }
  RVar21 = cfg->dst_c_width_vir;
  RVar3 = cfg->dst_c_height_vir;
  fdhist = -1;
  local_650 = mpp_get_soc_type();
  local_660 = (RK_U8 *)CONCAT71(local_660._1_7_,local_650 == 0x19);
  local_668 = (RK_U32 *)CONCAT71(local_668._1_7_,cfg->yuv_out_diff != 0);
  if ((ctx != (vdpp_com_ctx *)0x0) ||
     (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"vdpp","vdpp_test",0xff),
     (DAT_0011915b & 0x10) == 0)) {
    checkcrc.len = 0;
    checkcrc.sum_cnt = 0;
    checkcrc.sum = (RK_ULONG *)0x0;
    checkcrc.vor = 0;
    checkcrc._20_4_ = 0;
    checkcrc.sum = (RK_ULONG *)mpp_osal_malloc("vdpp_test",0x1000);
    iVar6 = mpp_buffer_group_get(&memGroup,3,0,"vdpp_test","vdpp_test");
    if (iVar6 != 0) {
      _mpp_log_l(2,"vdpp_test","memGroup mpp_buffer_group_get failed\n",0);
      _mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"0","vdpp_test",0x10b);
      if ((DAT_0011915b & 0x10) != 0) goto LAB_00103f6d;
    }
    __n = (ulong)(int)uVar16;
    _mpp_log_l(4,"vdpp_test","src w:h [%d:%d] stride [%d:%d] require buf %d",0,cfg->src_width,
               cfg->src_height,cfg->src_width_vir,cfg->src_height_vir,__n);
    RVar20 = cfg->dst_height_vir;
    uVar22 = uVar14;
    _mpp_log_l(4,"vdpp_test","dst w:h [%d:%d] stride [%d:%d] require buf %d",0,cfg->dst_width,
               cfg->dst_height,cfg->dst_width_vir,RVar20,uVar14);
    mpp_buffer_get_with_tag(memGroup,&srcbuf,__n,"vdpp_test","vdpp_test");
    local_628 = uVar14;
    mpp_buffer_get_with_tag(memGroup,&dstbuf,uVar14,"vdpp_test","vdpp_test");
    mpp_buffer_get_with_tag(memGroup,&histbuf,0x2800,"vdpp_test","vdpp_test");
    if ((((srcbuf != (MppBuffer)0x0) && (dstbuf != (MppBuffer)0x0)) && (histbuf != (MppBuffer)0x0))
       || (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"srcbuf && dstbuf && histbuf"
                      ,"vdpp_test",0x115,RVar20,uVar22), (DAT_0011915b & 0x10) == 0)) {
      mpp_buffer_get_with_tag(memGroup,&histbuf_l,0x4000,"vdpp_test","vdpp_test");
      mpp_buffer_get_with_tag(memGroup,&histbuf_g,0x400,"vdpp_test","vdpp_test");
      if (((histbuf_l != (MppBuffer)0x0) && (histbuf_g != (MppBuffer)0x0)) ||
         (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"histbuf_l && histbuf_g",
                     "vdpp_test",0x119), (DAT_0011915b & 0x10) == 0)) {
        uVar14 = (ulong)(RVar21 * RVar3 * 3);
        bVar5 = (byte)local_668 & (byte)local_660;
        __ptr = (void *)mpp_buffer_get_ptr_with_caller(srcbuf,"vdpp_test");
        local_660 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf,"vdpp_test");
        p_pack_hist_addr = (RK_U8 *)mpp_buffer_get_ptr_with_caller(histbuf,"vdpp_test");
        local_668 = (RK_U32 *)mpp_buffer_get_ptr_with_caller(histbuf_l,"vdpp_test");
        local_5f8 = (RK_U32 *)mpp_buffer_get_ptr_with_caller(histbuf_g,"vdpp_test");
        local_604 = mpp_buffer_get_fd_with_caller(srcbuf,"vdpp_test");
        local_608 = mpp_buffer_get_fd_with_caller(dstbuf,"vdpp_test");
        fdhist = mpp_buffer_get_fd_with_caller(histbuf);
        uVar16 = (uint)bVar5;
        if (uVar16 == 0) {
          local_654 = -1;
          local_648 = (RK_U8 *)0x0;
        }
        else {
          RVar21 = cfg->dst_c_height_vir;
          uVar22 = uVar14;
          _mpp_log_l(4,"vdpp_test","dst chroma w:h [%d:%d] stride [%d:%d] require buf %d",0,
                     cfg->dst_c_width,cfg->dst_c_height,cfg->dst_c_width_vir,RVar21,uVar14);
          mpp_buffer_get_with_tag(memGroup,&dstbuf_c,uVar14,"vdpp_test","vdpp_test");
          if ((dstbuf_c == (MppBuffer)0x0) &&
             (_mpp_log_l(2,"vdpp_test","Assertion %s failed at %s:%d\n",0,"dstbuf_c","vdpp_test",
                         0x12a,RVar21,uVar22), (DAT_0011915b & 0x10) != 0)) goto LAB_00103f6d;
          local_648 = (RK_U8 *)mpp_buffer_get_ptr_with_caller(dstbuf_c,"vdpp_test");
          local_654 = mpp_buffer_get_fd_with_caller(dstbuf_c);
        }
        local_600 = uVar14;
        (*ctx->ops->init)(&ctx->priv);
        if (local_650 == 0x19) {
          local_590[0] = 0x10;
          memset(&local_558,0,0x528);
          local_588 = cfg->src_format;
          uStack_578._0_4_ = cfg->src_width;
          uStack_578._4_4_ = cfg->src_height;
          uStack_570._0_4_ = cfg->src_width_vir;
          uStack_570._4_4_ = cfg->src_height_vir;
          local_584 = cfg->src_swa;
          local_580 = cfg->dst_fmt;
          local_568 = cfg->dst_width;
          RStack_564 = cfg->dst_height;
          RStack_560 = cfg->dst_width_vir;
          RStack_55c = cfg->dst_height_vir;
          if (uVar16 != 0) {
            local_554 = cfg->dst_c_width;
            RStack_550 = cfg->dst_c_height;
            RStack_54c = cfg->dst_c_width_vir;
            RStack_548 = cfg->dst_c_height_vir;
            local_558 = uVar16;
          }
          pRVar17 = local_540;
          local_57c = cfg->dst_swa;
          local_544 = cfg->hist_mode_en;
          VVar15 = VDPP_CMD_SET_COM2_CFG;
          lVar9 = 0x44;
        }
        else {
          pRVar17 = &local_580;
          local_590[0] = 0;
          memset(&uStack_570,0,0x540);
          local_588 = cfg->src_swa;
          local_57c = cfg->src_width;
          local_584 = cfg->dst_fmt;
          uVar1 = cfg->dst_width;
          uVar2 = cfg->dst_height;
          uStack_578 = CONCAT44(uVar1,cfg->src_height);
          uStack_570 = CONCAT44(uStack_570._4_4_,uVar2);
          lVar9 = 0x2c;
          VVar15 = VDPP_CMD_SET_COM_CFG;
        }
        *pRVar17 = *(RK_U32 *)(cfg->src_url + lVar9 + -0x48);
        (*ctx->ops->control)(ctx->priv,VVar15,local_590);
        RVar7 = (*ctx->ops->check_cap)(ctx->priv);
        uVar18 = 0;
        _mpp_log_l(4,"vdpp_test","vdpp cap %d\n",0,RVar7);
        bVar19 = local_648 != (RK_U8 *)0x0;
        local_630 = ctx;
        do {
          sVar10 = fread(__ptr,1,__n,(FILE *)cfg->fp_src);
          if (sVar10 < __n) {
            pcVar12 = "source exhaused\n";
            uStackY_6a0 = 4;
LAB_00103e1f:
            _mpp_log_l(uStackY_6a0,"vdpp_test",pcVar12,0);
LAB_00103e97:
            mpp_buffer_put_with_caller(srcbuf,"vdpp_test");
            mpp_buffer_put_with_caller(dstbuf,"vdpp_test");
            mpp_buffer_put_with_caller(histbuf,"vdpp_test");
            if (histbuf_l != (MppBuffer)0x0) {
              mpp_buffer_put_with_caller(histbuf_l,"vdpp_test");
            }
            if (histbuf_g != (MppBuffer)0x0) {
              mpp_buffer_put_with_caller(histbuf_g,"vdpp_test");
            }
            if (uVar16 != 0) {
              mpp_buffer_put_with_caller(dstbuf_c,"vdpp_test");
            }
            if (checkcrc.sum != (RK_ULONG *)0x0) {
              mpp_osal_free("vdpp_test");
            }
            checkcrc.sum = (RK_ULONG *)0x0;
            if (memGroup != (MppBufferGroup)0x0) {
              mpp_buffer_group_put();
              memGroup = (MppBufferGroup)0x0;
            }
            (*ctx->ops->deinit)(ctx->priv);
            rockchip_vdpp_api_release_ctx(ctx);
            return;
          }
          if (cfg->frame_num <= uVar18) goto LAB_00103e97;
          vdpp_test_set_img(ctx,cfg->src_width_vir,cfg->src_height_vir,&imgsrc,local_604,
                            VDPP_CMD_SET_SRC);
          vdpp_test_set_img(ctx,cfg->dst_width_vir,cfg->dst_height_vir,&imgdst,local_608,
                            VDPP_CMD_SET_DST);
          if (uVar16 == 0) {
            pRVar17 = local_668;
            if (local_650 == 0x19) goto LAB_00103b71;
          }
          else {
            vdpp_test_set_img(ctx,cfg->dst_c_width_vir,cfg->dst_c_height_vir,&imgdst_c,local_654,
                              VDPP_CMD_SET_DST_C);
LAB_00103b71:
            pRVar17 = local_668;
            (*ctx->ops->control)(ctx->priv,VDPP_CMD_SET_HIST_FD,&fdhist);
          }
          memset(local_660,0,local_628);
          memset(p_pack_hist_addr,0,0x2800);
          MVar8 = (*ctx->ops->control)(ctx->priv,VDPP_CMD_RUN_SYNC,(void *)0x0);
          uVar14 = local_628;
          if (MVar8 != MPP_OK) {
            pcVar12 = "found vdpp run error, exit!\n";
LAB_00103e1d:
            uStackY_6a0 = 2;
            goto LAB_00103e1f;
          }
          if (((FILE *)cfg->fp_dst != (FILE *)0x0) &&
             (sVar10 = fwrite(local_660,1,local_628,(FILE *)cfg->fp_dst), pRVar17 = local_668,
             sVar10 < uVar14)) {
            piVar11 = __errno_location();
            iVar6 = *piVar11;
            pcVar12 = strerror(iVar6);
            pcVar13 = "destination dump failed, errno %d %s\n";
LAB_00103e85:
            _mpp_log_l(2,"vdpp_test",pcVar13,0,iVar6,pcVar12);
            goto LAB_00103e97;
          }
          uVar14 = local_600;
          if (((uVar16 != 0) && ((FILE *)cfg->fp_dst_c != (FILE *)0x0)) &&
             (sVar10 = fwrite(local_648,1,local_600,(FILE *)cfg->fp_dst_c), pRVar17 = local_668,
             sVar10 < uVar14)) {
            piVar11 = __errno_location();
            iVar6 = *piVar11;
            pcVar12 = strerror(iVar6);
            pcVar13 = "chroma dump failed, errno %d %s\n";
            goto LAB_00103e85;
          }
          if (((FILE *)cfg->fp_hist != (FILE *)0x0) &&
             (sVar10 = fwrite(p_pack_hist_addr,1,0x2800,(FILE *)cfg->fp_hist), sVar10 < 0x2800)) {
            pcVar12 = "packed hist dump err\n";
            goto LAB_00103e1d;
          }
          memset(pRVar17,0,0x4000);
          p_hist_global = local_5f8;
          memset(local_5f8,0,0x400);
          dci_hist_info_parser(p_pack_hist_addr,pRVar17,p_hist_global);
          if (((FILE *)cfg->fp_hist_l != (FILE *)0x0) &&
             (sVar10 = fwrite(pRVar17,1,0x4000,(FILE *)cfg->fp_hist_l), sVar10 < 0x4000)) {
            pcVar12 = "local hist dump err\n";
LAB_00103e49:
            _mpp_log_l(2,"vdpp_test",pcVar12,0);
            ctx = local_630;
            goto LAB_00103e97;
          }
          if (((FILE *)cfg->fp_hist_g != (FILE *)0x0) &&
             (sVar10 = fwrite(local_5f8,1,0x400,(FILE *)cfg->fp_hist_g), sVar10 < 0x400)) {
            pcVar12 = "global hist dump err\n";
            goto LAB_00103e49;
          }
          ctx = local_630;
          if (cfg->fp_slt != (FILE *)0x0) {
            if ((local_660 != (RK_U8 *)0x0) && (cfg->hist_mode_en == 0)) {
              calc_data_crc(local_660,(RK_U32)local_628,&checkcrc);
              write_data_crc(cfg->fp_slt,&checkcrc);
            }
            if (((bVar19 & bVar5) != 0) && (cfg->hist_mode_en == 0)) {
              calc_data_crc(local_648,(RK_U32)local_600,&checkcrc);
              write_data_crc(cfg->fp_slt,&checkcrc);
            }
            calc_data_crc(p_pack_hist_addr,0x2800,&checkcrc);
            write_data_crc(cfg->fp_slt,&checkcrc);
          }
          uVar18 = uVar18 + 1;
        } while( true );
      }
    }
  }
LAB_00103f6d:
  abort();
}

Assistant:

void vdpp_test(VdppTestCfg *cfg)
{
    vdpp_com_ctx* vdpp = rockchip_vdpp_api_alloc_ctx();
    size_t srcfrmsize = get_src_frm_size(cfg->src_format, cfg->src_width_vir, cfg->src_height_vir);
    size_t dstfrmsize = get_dst_frm_size(cfg->dst_fmt, cfg->dst_width_vir, cfg->dst_height_vir);
    size_t dstfrmsize_c = cfg->dst_c_width_vir * cfg->dst_c_height_vir * 3;
    MppBuffer srcbuf;
    MppBuffer dstbuf;
    MppBuffer dstbuf_c;
    MppBuffer histbuf;
    MppBuffer histbuf_l;
    MppBuffer histbuf_g;
    RK_U8 *psrc = NULL;
    RK_U8 *pdst = NULL;
    RK_U8 *pdst_c = NULL;
    RK_U8 *phist = NULL;
    RK_U8 *phist_l = NULL;
    RK_U8 *phist_g = NULL;
    RK_S32 fdsrc = -1;
    RK_S32 fddst = -1;
    RK_S32 fddst_c = -1;
    RK_S32 fdhist = -1;
    struct vdpp_api_params params;
    RK_U32 is_vdpp2 = (mpp_get_soc_type() == ROCKCHIP_SOC_RK3576);
    RK_U32 yuv_out_diff = (cfg->yuv_out_diff && is_vdpp2);

    VdppImg imgsrc;
    VdppImg imgdst;
    VdppImg imgdst_c;

    RK_U32 local_hist_size  = RKVOP_PQ_PREPROCESS_HIST_SIZE_VERI * RKVOP_PQ_PREPROCESS_HIST_SIZE_HORI *
                              RKVOP_PQ_PREPROCESS_LOCAL_HIST_BIN_NUMS * sizeof(RK_U32);
    RK_U32 global_hist_size = RKVOP_PQ_PREPROCESS_GLOBAL_HIST_BIN_NUMS * sizeof(RK_U32);

    mpp_assert(vdpp);
    MppBufferGroup memGroup;
    MPP_RET ret = MPP_NOK;
    RK_U32 cnt = 0;
    DataCrc checkcrc;

    memset(&checkcrc, 0, sizeof(checkcrc));
    checkcrc.sum = mpp_malloc(RK_ULONG, 512);

    ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        mpp_assert(0);
    }

    mpp_log("src w:h [%d:%d] stride [%d:%d] require buf %d",
            cfg->src_width, cfg->src_height, cfg->src_width_vir, cfg->src_height_vir, srcfrmsize);
    mpp_log("dst w:h [%d:%d] stride [%d:%d] require buf %d",
            cfg->dst_width, cfg->dst_height, cfg->dst_width_vir, cfg->dst_height_vir, dstfrmsize);
    mpp_buffer_get(memGroup, &srcbuf, srcfrmsize);
    mpp_buffer_get(memGroup, &dstbuf, dstfrmsize);
    mpp_buffer_get(memGroup, &histbuf, DCI_HIST_SIZE);
    mpp_assert(srcbuf && dstbuf && histbuf);

    mpp_buffer_get(memGroup, &histbuf_l, local_hist_size);
    mpp_buffer_get(memGroup, &histbuf_g, global_hist_size);
    mpp_assert(histbuf_l && histbuf_g);

    psrc = mpp_buffer_get_ptr(srcbuf);
    pdst = mpp_buffer_get_ptr(dstbuf);
    phist = mpp_buffer_get_ptr(histbuf);
    phist_l = mpp_buffer_get_ptr(histbuf_l);
    phist_g = mpp_buffer_get_ptr(histbuf_g);

    fdsrc = mpp_buffer_get_fd(srcbuf);
    fddst = mpp_buffer_get_fd(dstbuf);
    fdhist = mpp_buffer_get_fd(histbuf);

    if (yuv_out_diff) {
        mpp_log("dst chroma w:h [%d:%d] stride [%d:%d] require buf %d",
                cfg->dst_c_width, cfg->dst_c_height, cfg->dst_c_width_vir, cfg->dst_c_height_vir, dstfrmsize_c);

        mpp_buffer_get(memGroup, &dstbuf_c, dstfrmsize_c);
        mpp_assert(dstbuf_c);

        pdst_c = mpp_buffer_get_ptr(dstbuf_c);
        fddst_c = mpp_buffer_get_fd(dstbuf_c);
    }

    vdpp->ops->init(&vdpp->priv);

    /* use default dmsr and zme params */
    /* set common params */
    if (is_vdpp2) {
        params.ptype = VDPP_PARAM_TYPE_COM2;
        memset(&params.param, 0, sizeof(union vdpp_api_content));
        params.param.com2.sfmt = cfg->src_format;
        params.param.com2.src_width = cfg->src_width;
        params.param.com2.src_height = cfg->src_height;
        params.param.com2.src_width_vir = cfg->src_width_vir;
        params.param.com2.src_height_vir = cfg->src_height_vir;
        params.param.com2.sswap = cfg->src_swa;
        params.param.com2.dfmt = cfg->dst_fmt;
        params.param.com2.dst_width = cfg->dst_width;
        params.param.com2.dst_height = cfg->dst_height;
        params.param.com2.dst_width_vir = cfg->dst_width_vir;
        params.param.com2.dst_height_vir = cfg->dst_height_vir;
        if (yuv_out_diff) {
            params.param.com2.yuv_out_diff = yuv_out_diff;
            params.param.com2.dst_c_width = cfg->dst_c_width;
            params.param.com2.dst_c_height = cfg->dst_c_height;
            params.param.com2.dst_c_width_vir = cfg->dst_c_width_vir;
            params.param.com2.dst_c_height_vir = cfg->dst_c_height_vir;
        }
        params.param.com2.dswap = cfg->dst_swa;
        params.param.com2.hist_mode_en = cfg->hist_mode_en;
        params.param.com2.cfg_set = cfg->cfg_set;
        vdpp->ops->control(vdpp->priv, VDPP_CMD_SET_COM2_CFG, &params);
    } else {
        params.ptype = VDPP_PARAM_TYPE_COM;
        memset(&params.param, 0, sizeof(union vdpp_api_content));
        params.param.com.src_width = cfg->src_width;
        params.param.com.src_height = cfg->src_height;
        params.param.com.sswap = cfg->src_swa;
        params.param.com.dfmt = cfg->dst_fmt;
        params.param.com.dst_width = cfg->dst_width;
        params.param.com.dst_height = cfg->dst_height;
        params.param.com.dswap = cfg->dst_swa;
        vdpp->ops->control(vdpp->priv, VDPP_CMD_SET_COM_CFG, &params);
    }

    {
        RK_S32 cap = vdpp->ops->check_cap(vdpp->priv);

        mpp_log("vdpp cap %d\n", cap);
    }

    while (1) {
        if (srcfrmsize > fread(psrc, 1, srcfrmsize, cfg->fp_src)) {
            mpp_log("source exhaused\n");
            break;
        }
        if (cnt >= cfg->frame_num)
            break;

        /* notice the order of the input frames */
        vdpp_test_set_img(vdpp, cfg->src_width_vir, cfg->src_height_vir,
                          &imgsrc, fdsrc, VDPP_CMD_SET_SRC);
        vdpp_test_set_img(vdpp, cfg->dst_width_vir, cfg->dst_height_vir,
                          &imgdst, fddst, VDPP_CMD_SET_DST);
        if (yuv_out_diff)
            vdpp_test_set_img(vdpp, cfg->dst_c_width_vir, cfg->dst_c_height_vir,
                              &imgdst_c, fddst_c, VDPP_CMD_SET_DST_C);

        if (is_vdpp2)
            vdpp->ops->control(vdpp->priv, VDPP_CMD_SET_HIST_FD, &fdhist);

        memset(pdst, 0, dstfrmsize);
        memset(phist, 0, DCI_HIST_SIZE);

        if (vdpp->ops->control(vdpp->priv, VDPP_CMD_RUN_SYNC, NULL)) {
            mpp_err("found vdpp run error, exit!\n");
            break;
        }

        cnt++;

        if (cfg->fp_dst) {
            if (dstfrmsize > fwrite(pdst, 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed, errno %d %s\n", errno, strerror(errno));
                break;
            }
        }

        if (yuv_out_diff && cfg->fp_dst_c) {
            if (dstfrmsize_c > fwrite(pdst_c, 1, dstfrmsize_c, cfg->fp_dst_c)) {
                mpp_err("chroma dump failed, errno %d %s\n", errno, strerror(errno));
                break;
            }
        }

        if (cfg->fp_hist) {
            if (DCI_HIST_SIZE > fwrite(phist, 1, DCI_HIST_SIZE, cfg->fp_hist)) {
                mpp_err("packed hist dump err\n");
                break;
            }
        }

        memset(phist_l, 0, local_hist_size);
        memset(phist_g, 0, global_hist_size);

        dci_hist_info_parser(phist, (RK_U32 *)phist_l, (RK_U32 *)phist_g);

        if (cfg->fp_hist_l) {
            if (local_hist_size > fwrite(phist_l, 1, local_hist_size, cfg->fp_hist_l)) {
                mpp_err("local hist dump err\n");
                break;
            }
        }
        if (cfg->fp_hist_g) {
            if (global_hist_size > fwrite(phist_g, 1, global_hist_size, cfg->fp_hist_g)) {
                mpp_err("global hist dump err\n");
                break;
            }
        }

        if (cfg->fp_slt) {
            if (pdst && !cfg->hist_mode_en) {
                calc_data_crc(pdst, dstfrmsize, &checkcrc);
                write_data_crc(cfg->fp_slt, &checkcrc);

            }

            if (pdst_c && yuv_out_diff && !cfg->hist_mode_en) {
                calc_data_crc(pdst_c, dstfrmsize_c, &checkcrc);
                write_data_crc(cfg->fp_slt, &checkcrc);

            }

            if (phist) {
                calc_data_crc(phist, DCI_HIST_SIZE, &checkcrc);
                write_data_crc(cfg->fp_slt, &checkcrc);
            }
        }

    }

    mpp_buffer_put(srcbuf);
    mpp_buffer_put(dstbuf);
    mpp_buffer_put(histbuf);
    if (histbuf_l)
        mpp_buffer_put(histbuf_l);
    if (histbuf_g)
        mpp_buffer_put(histbuf_g);
    if (yuv_out_diff)
        mpp_buffer_put(dstbuf_c);

    MPP_FREE(checkcrc.sum);

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    vdpp->ops->deinit(vdpp->priv);

    rockchip_vdpp_api_release_ctx(vdpp);
}